

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstriebuilder.cpp
# Opt level: O1

int32_t __thiscall
icu_63::UCharsTrieBuilder::writeValueAndType
          (UCharsTrieBuilder *this,UBool hasValue,int32_t value,int32_t node)

{
  int iVar1;
  ssize_t sVar2;
  undefined4 in_register_0000000c;
  void *__buf;
  UChar intUnits [3];
  undefined1 local_6 [6];
  
  if (hasValue != '\0') {
    if ((uint)value < 0xfe0000) {
      if (value < 0x100) {
        __buf = (void *)0x1;
      }
      else {
        __buf = (void *)0x2;
      }
    }
    else {
      __buf = (void *)0x3;
    }
    sVar2 = write(this,(int)local_6,__buf,CONCAT44(in_register_0000000c,node));
    return (int32_t)sVar2;
  }
  iVar1 = (*(this->super_StringTrieBuilder).super_UObject._vptr_UObject[0xf])
                    (this,(ulong)(uint)node);
  return iVar1;
}

Assistant:

int32_t
UCharsTrieBuilder::writeValueAndType(UBool hasValue, int32_t value, int32_t node) {
    if(!hasValue) {
        return write(node);
    }
    UChar intUnits[3];
    int32_t length;
    if(value<0 || value>UCharsTrie::kMaxTwoUnitNodeValue) {
        intUnits[0]=(UChar)(UCharsTrie::kThreeUnitNodeValueLead);
        intUnits[1]=(UChar)((uint32_t)value>>16);
        intUnits[2]=(UChar)value;
        length=3;
    } else if(value<=UCharsTrie::kMaxOneUnitNodeValue) {
        intUnits[0]=(UChar)((value+1)<<6);
        length=1;
    } else {
        intUnits[0]=(UChar)(UCharsTrie::kMinTwoUnitNodeValueLead+((value>>10)&0x7fc0));
        intUnits[1]=(UChar)value;
        length=2;
    }
    intUnits[0]|=(UChar)node;
    return write(intUnits, length);
}